

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void jit_rec_SET_N(Trace *trace,BcIns bc)

{
  IrRef IVar1;
  
  IVar1 = ir_load_const(trace,bc >> 0x10);
  trace->last_modified[(ulong)(bc >> 8) & 0xff] = IVar1;
  return;
}

Assistant:

void jit_rec_SET_N(Trace *trace, BcIns bc) {
	// Load the constant
	IrRef load = ir_load_const(trace, bc_arg16(bc));
	trace->last_modified[bc_arg1(bc)] = load;
}